

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O3

void Hop_ManCleanData(Hop_Man_t *p)

{
  int iVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  
  p->nTravIds = 1;
  (p->pConst1->field_0).pData = (void *)0x0;
  pVVar3 = p->vPis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(undefined8 *)pVVar3->pArray[lVar2] = 0;
      lVar2 = lVar2 + 1;
      pVVar3 = p->vPis;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3 = p->vPos;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(undefined8 *)pVVar3->pArray[lVar2] = 0;
      lVar2 = lVar2 + 1;
      pVVar3 = p->vPos;
    } while (lVar2 < pVVar3->nSize);
  }
  iVar1 = p->nTableSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (p->pTable[lVar2] != (Hop_Obj_t *)0x0) {
        (p->pTable[lVar2]->field_0).pData = (void *)0x0;
        iVar1 = p->nTableSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

void Hop_ManCleanData( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    p->nTravIds = 1;
    Hop_ManConst1(p)->pData = NULL;
    Hop_ManForEachPi( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachPo( p, pObj, i )
        pObj->pData = NULL;
    Hop_ManForEachNode( p, pObj, i )
        pObj->pData = NULL;
}